

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_server2.c
# Opt level: O3

sni_entry * sni_parse(char *sni_string)

{
  char *path;
  char *path_00;
  char *s;
  int iVar1;
  sni_entry *head;
  char *pcVar2;
  mbedtls_x509_crt *pmVar3;
  mbedtls_pk_context *pmVar4;
  mbedtls_x509_crl *crl;
  sni_entry *head_00;
  char *pcVar5;
  char *pcVar6;
  char *pcVar7;
  char *pcVar8;
  char *pcVar9;
  
  pcVar7 = sni_string + -1;
  do {
    pcVar6 = pcVar7 + 1;
    pcVar7 = pcVar7 + 1;
  } while (*pcVar6 != '\0');
  *pcVar7 = ',';
  if (pcVar7 < sni_string) {
LAB_001117f7:
    head = (sni_entry *)0x0;
  }
  else {
    head_00 = (sni_entry *)0x0;
    do {
      head = (sni_entry *)calloc(1,0x38);
      if (head == (sni_entry *)0x0) {
LAB_001117ef:
        sni_free(head_00);
        goto LAB_001117f7;
      }
      head->name = sni_string;
      while (*sni_string != ',') {
        sni_string = sni_string + 1;
        if (pcVar7 < sni_string) goto LAB_001117e2;
      }
      *sni_string = '\0';
      pcVar6 = sni_string + 1;
      while (*pcVar6 != ',') {
        pcVar6 = pcVar6 + 1;
        if (pcVar7 < pcVar6) goto LAB_001117e2;
      }
      *pcVar6 = '\0';
      pcVar9 = pcVar6 + 1;
      while (*pcVar9 != ',') {
        pcVar9 = pcVar9 + 1;
        if (pcVar7 < pcVar9) goto LAB_001117e2;
      }
      *pcVar9 = '\0';
      path = pcVar9 + 1;
      pcVar8 = path;
      while (*pcVar8 != ',') {
        pcVar8 = pcVar8 + 1;
        if (pcVar7 < pcVar8) goto LAB_001117e2;
      }
      *pcVar8 = '\0';
      path_00 = pcVar8 + 1;
      pcVar5 = path_00;
      while (*pcVar5 != ',') {
        pcVar5 = pcVar5 + 1;
        if (pcVar7 < pcVar5) goto LAB_001117e2;
      }
      *pcVar5 = '\0';
      s = pcVar5 + 1;
      pcVar2 = s;
      while (*pcVar2 != ',') {
        pcVar2 = pcVar2 + 1;
        if (pcVar7 < pcVar2) goto LAB_001117e2;
      }
      *pcVar2 = '\0';
      pmVar3 = (mbedtls_x509_crt *)calloc(1,0x228);
      head->cert = pmVar3;
      if (pmVar3 == (mbedtls_x509_crt *)0x0) {
LAB_001117e2:
        sni_free(head);
        goto LAB_001117ef;
      }
      pmVar4 = (mbedtls_pk_context *)calloc(1,0x10);
      head->key = pmVar4;
      if (pmVar4 == (mbedtls_pk_context *)0x0) goto LAB_001117e2;
      mbedtls_x509_crt_init(pmVar3);
      mbedtls_pk_init(head->key);
      iVar1 = mbedtls_x509_crt_parse_file(head->cert,sni_string + 1);
      if ((iVar1 != 0) ||
         (iVar1 = mbedtls_pk_parse_keyfile(head->key,pcVar6 + 1,anon_var_dwarf_330da + 9),
         iVar1 != 0)) goto LAB_001117e2;
      if ((*path != '-') || (pcVar9[2] != '\0')) {
        pmVar3 = (mbedtls_x509_crt *)calloc(1,0x228);
        head->ca = pmVar3;
        if (pmVar3 != (mbedtls_x509_crt *)0x0) {
          mbedtls_x509_crt_init(pmVar3);
          iVar1 = mbedtls_x509_crt_parse_file(head->ca,path);
          if (iVar1 == 0) goto LAB_00111743;
        }
        goto LAB_001117e2;
      }
LAB_00111743:
      if ((*path_00 != '-') || (pcVar8[2] != '\0')) {
        crl = (mbedtls_x509_crl *)calloc(1,0x1a0);
        head->crl = crl;
        if (crl != (mbedtls_x509_crl *)0x0) {
          mbedtls_x509_crl_init(crl);
          iVar1 = mbedtls_x509_crl_parse_file(head->crl,path_00);
          if (iVar1 == 0) goto LAB_00111797;
        }
        goto LAB_001117e2;
      }
LAB_00111797:
      if ((*s == '-') && (pcVar5[2] == '\0')) {
        head->authmode = -1;
      }
      else {
        iVar1 = get_auth_mode(s);
        head->authmode = iVar1;
        if (iVar1 < 0) goto LAB_001117e2;
      }
      sni_string = pcVar2 + 1;
      head->next = head_00;
      head_00 = head;
    } while (sni_string <= pcVar7);
  }
  return head;
}

Assistant:

sni_entry *sni_parse( char *sni_string )
{
    sni_entry *cur = NULL, *new = NULL;
    char *p = sni_string;
    char *end = p;
    char *crt_file, *key_file, *ca_file, *crl_file, *auth_str;

    while( *end != '\0' )
        ++end;
    *end = ',';

    while( p <= end )
    {
        if( ( new = mbedtls_calloc( 1, sizeof( sni_entry ) ) ) == NULL )
        {
            sni_free( cur );
            return( NULL );
        }

        GET_ITEM( new->name );
        GET_ITEM( crt_file );
        GET_ITEM( key_file );
        GET_ITEM( ca_file );
        GET_ITEM( crl_file );
        GET_ITEM( auth_str );

        if( ( new->cert = mbedtls_calloc( 1, sizeof( mbedtls_x509_crt ) ) ) == NULL ||
            ( new->key = mbedtls_calloc( 1, sizeof( mbedtls_pk_context ) ) ) == NULL )
            goto error;

        mbedtls_x509_crt_init( new->cert );
        mbedtls_pk_init( new->key );

        if( mbedtls_x509_crt_parse_file( new->cert, crt_file ) != 0 ||
            mbedtls_pk_parse_keyfile( new->key, key_file, "" ) != 0 )
            goto error;

        if( strcmp( ca_file, "-" ) != 0 )
        {
            if( ( new->ca = mbedtls_calloc( 1, sizeof( mbedtls_x509_crt ) ) ) == NULL )
                goto error;

            mbedtls_x509_crt_init( new->ca );

            if( mbedtls_x509_crt_parse_file( new->ca, ca_file ) != 0 )
                goto error;
        }

        if( strcmp( crl_file, "-" ) != 0 )
        {
            if( ( new->crl = mbedtls_calloc( 1, sizeof( mbedtls_x509_crl ) ) ) == NULL )
                goto error;

            mbedtls_x509_crl_init( new->crl );

            if( mbedtls_x509_crl_parse_file( new->crl, crl_file ) != 0 )
                goto error;
        }

        if( strcmp( auth_str, "-" ) != 0 )
        {
            if( ( new->authmode = get_auth_mode( auth_str ) ) < 0 )
                goto error;
        }
        else
            new->authmode = DFL_AUTH_MODE;

        new->next = cur;
        cur = new;
    }

    return( cur );

error:
    sni_free( new );
    sni_free( cur );
    return( NULL );
}